

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O2

bool __thiscall ParsedH264TrackData::spsppsExists(ParsedH264TrackData *this,uint8_t *buff,int size)

{
  uint32_t uVar1;
  byte bVar2;
  byte bVar3;
  ulong uVar4;
  uint32_t *cur32;
  uint32_t *puVar5;
  byte bVar6;
  byte bVar7;
  
  bVar2 = this->m_nalSize;
  bVar7 = 0;
  bVar6 = 0;
  for (puVar5 = (uint32_t *)buff; uVar4 = (ulong)bVar2, puVar5 < buff + ((long)size - uVar4);
      puVar5 = (uint32_t *)((long)puVar5 + (ulong)(uVar1 + bVar2))) {
    if (bVar2 == 4) {
      uVar1 = my_ntohl(*puVar5);
      bVar2 = this->m_nalSize;
      uVar4 = (ulong)bVar2;
    }
    else {
      uVar1 = (uint)*(byte *)((long)puVar5 + 2) |
              (uint)*(byte *)((long)puVar5 + 1) << 8 | (uint)(byte)*puVar5 << 0x10;
    }
    bVar3 = *(byte *)((long)puVar5 + uVar4) & 0x1f;
    if (bVar3 == 7) {
      bVar6 = 1;
    }
    else if (bVar3 == 8) {
      bVar7 = 1;
    }
  }
  return (bool)(bVar6 & bVar7);
}

Assistant:

bool ParsedH264TrackData::spsppsExists(uint8_t* buff, const int size)
{
    uint8_t* curPos = buff;
    const uint8_t* end = buff + size;
    bool spsFound = false;
    bool ppsFound = false;
    while (curPos < end - m_nalSize)
    {
        uint32_t elSize;
        if (m_nalSize == 4)
        {
            const auto cur32 = reinterpret_cast<uint32_t*>(curPos);
            elSize = my_ntohl(*cur32);
        }
        else
            elSize = (curPos[0] << 16l) + (curPos[1] << 8l) + curPos[2];
        const auto nalUnitType = static_cast<NALUnit::NALType>(curPos[m_nalSize] & 0x1f);
        if (nalUnitType == NALUnit::NALType::nuSPS)
            spsFound = true;
        else if (nalUnitType == NALUnit::NALType::nuPPS)
            ppsFound = true;
        curPos += elSize + m_nalSize;
    }
    return spsFound && ppsFound;
}